

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int setup_application_space(quicly_conn_t *conn)

{
  int iVar1;
  st_quicly_application_space_t *psVar2;
  
  psVar2 = (st_quicly_application_space_t *)alloc_pn_space(0x128,2);
  conn->application = psVar2;
  if (psVar2 != (st_quicly_application_space_t *)0x0) {
    (psVar2->cipher).egress.key_update_pn.last = 0;
    (psVar2->cipher).egress.key_update_pn.next = 0xffffffffffffffff;
    iVar1 = create_handshake_flow(conn,3);
    return iVar1;
  }
  return 0x201;
}

Assistant:

static int setup_application_space(quicly_conn_t *conn)
{
    if ((conn->application =
             (void *)alloc_pn_space(sizeof(struct st_quicly_application_space_t), QUICLY_DEFAULT_PACKET_TOLERANCE)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    /* prohibit key-update until receiving an ACK for an 1-RTT packet */
    conn->application->cipher.egress.key_update_pn.last = 0;
    conn->application->cipher.egress.key_update_pn.next = UINT64_MAX;

    return create_handshake_flow(conn, QUICLY_EPOCH_1RTT);
}